

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_uint mz_zip_reader_get_filename
                  (mz_zip_archive *pZip,mz_uint file_index,char *pFilename,mz_uint filename_buf_size
                  )

{
  ushort uVar1;
  mz_zip_internal_state *pmVar2;
  uint uVar3;
  mz_uint mVar4;
  long lVar5;
  
  if ((((pZip == (mz_zip_archive *)0x0) ||
       (pmVar2 = pZip->m_pState, pmVar2 == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    lVar5 = 0;
  }
  else {
    lVar5 = (ulong)*(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
            (long)(pmVar2->m_central_dir).m_p;
  }
  if (lVar5 == 0) {
    mVar4 = 0;
    if (filename_buf_size != 0) {
      *pFilename = '\0';
    }
  }
  else {
    uVar1 = *(ushort *)(lVar5 + 0x1c);
    uVar3 = (uint)uVar1;
    if (filename_buf_size != 0) {
      uVar3 = filename_buf_size - 1;
      if ((uint)uVar1 < filename_buf_size - 1) {
        uVar3 = (uint)uVar1;
      }
      memcpy(pFilename,(void *)(lVar5 + 0x2e),(ulong)uVar3);
      pFilename[uVar3] = '\0';
    }
    mVar4 = uVar3 + 1;
  }
  return mVar4;
}

Assistant:

mz_uint mz_zip_reader_get_filename(mz_zip_archive *pZip, mz_uint file_index,
                                   char *pFilename, mz_uint filename_buf_size) {
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if (!p) {
    if (filename_buf_size)
      pFilename[0] = '\0';
    return 0;
  }
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  if (filename_buf_size) {
    n = MZ_MIN(n, filename_buf_size - 1);
    memcpy(pFilename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
    pFilename[n] = '\0';
  }
  return n + 1;
}